

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

COVER_dictSelection_t *
COVER_selectDict(BYTE *customDictContent,size_t dictBufferCapacity,size_t dictContentSize,
                BYTE *samplesBuffer,size_t *samplesSizes,uint nbFinalizeSamples,
                size_t nbCheckSamples,size_t nbSamples,ZDICT_cover_params_t params,size_t *offsets,
                size_t totalCompressedSize)

{
  ZDICT_cover_params_t parameters;
  ZDICT_cover_params_t parameters_00;
  uint uVar1;
  size_t nbSamples_00;
  BYTE *dict;
  BYTE *buf;
  size_t *offsets_00;
  size_t s;
  size_t csz;
  size_t in_RCX;
  size_t in_RDX;
  void *in_RSI;
  COVER_dictSelection_t *in_RDI;
  size_t *in_R8;
  BYTE *in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined1 in_stack_0000000c [20];
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  int in_stack_00000038;
  uint in_stack_0000003c;
  size_t in_stack_00000040;
  double regressionTolerance;
  BYTE *candidateDictBuffer;
  BYTE *largestDictbuffer;
  BYTE *customDictContentEnd;
  size_t largestCompressed;
  size_t largestDict;
  void *in_stack_00000108;
  uint in_stack_00000120;
  undefined1 in_stack_00000128 [12];
  size_t in_stack_ffffffffffffff60;
  size_t sVar4;
  size_t sVar5;
  size_t *offsets_01;
  size_t *local_18;
  
  offsets_01 = (size_t *)0x0;
  sVar5 = 0;
  nbSamples_00 = (long)in_RSI + in_RCX;
  dict = (BYTE *)malloc(in_RDX);
  buf = (BYTE *)malloc(in_RDX);
  if ((dict == (BYTE *)0x0) || (buf == (BYTE *)0x0)) {
    free(dict);
    free(buf);
    COVER_dictSelectionError(in_stack_ffffffffffffff60);
  }
  else {
    memcpy(dict,in_RSI,in_RCX);
    sVar4 = in_stack_00000040;
    offsets_00 = (size_t *)
                 ZDICT_finalizeDictionary
                           (in_stack_00000108,totalCompressedSize,offsets,params._40_8_,
                            (void *)params.zParams._0_8_,(size_t *)params._24_8_,in_stack_00000120,
                            (ZDICT_params_t)in_stack_00000128);
    uVar1 = ZDICT_isError(0x2927a9);
    if (uVar1 == 0) {
      parameters._8_8_ = in_RSI;
      parameters.k = (int)in_RDX;
      parameters.d = (int)(in_RDX >> 0x20);
      parameters.shrinkDict = in_stack_00000008;
      parameters.splitPoint = (double)unaff_retaddr;
      parameters._28_20_ = in_stack_0000000c;
      sVar4 = in_stack_00000028;
      sVar5 = COVER_checkTotalCompressedSize
                        (parameters,in_R8,in_R9,offsets_01,sVar5,nbSamples_00,dict,in_stack_00000020
                        );
      uVar1 = ZSTD_isError(0x29284a);
      if (uVar1 == 0) {
        if (in_stack_00000038 == 0) {
          free(buf);
          setDictSelection(in_RDI,dict,(size_t)offsets_00,sVar5);
        }
        else {
          local_18 = (size_t *)0x100;
          while (local_18 < offsets_00) {
            memcpy(buf,dict,(size_t)offsets_00);
            sVar4 = in_stack_00000040;
            s = ZDICT_finalizeDictionary
                          (in_stack_00000108,totalCompressedSize,offsets,params._40_8_,
                           (void *)params.zParams._0_8_,(size_t *)params._24_8_,in_stack_00000120,
                           (ZDICT_params_t)in_stack_00000128);
            uVar1 = ZDICT_isError(0x292975);
            if (uVar1 != 0) {
              free(dict);
              free(buf);
              COVER_dictSelectionError(sVar4);
              return in_RDI;
            }
            parameters_00._8_8_ = in_RSI;
            parameters_00.k = (int)in_RDX;
            parameters_00.d = (int)(in_RDX >> 0x20);
            parameters_00.shrinkDict = in_stack_00000008;
            parameters_00.splitPoint = (double)unaff_retaddr;
            parameters_00._28_20_ = in_stack_0000000c;
            sVar4 = in_stack_00000028;
            csz = COVER_checkTotalCompressedSize
                            (parameters_00,in_R8,in_R9,offsets_00,sVar5,nbSamples_00,dict,
                             in_stack_00000020);
            uVar1 = ZSTD_isError(0x292a16);
            if (uVar1 != 0) {
              free(dict);
              free(buf);
              COVER_dictSelectionError(sVar4);
              return in_RDI;
            }
            auVar3._8_4_ = (int)(csz >> 0x20);
            auVar3._0_8_ = csz;
            auVar3._12_4_ = 0x45300000;
            auVar2._8_4_ = (int)(sVar5 >> 0x20);
            auVar2._0_8_ = sVar5;
            auVar2._12_4_ = 0x45300000;
            if ((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)csz) - 4503599627370496.0) <=
                ((auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) *
                ((double)in_stack_0000003c / 100.0 + 1.0)) {
              free(dict);
              setDictSelection(in_RDI,buf,s,csz);
              return in_RDI;
            }
            local_18 = (size_t *)(s << 1);
          }
          free(buf);
          setDictSelection(in_RDI,dict,(size_t)offsets_00,sVar5);
        }
      }
      else {
        free(dict);
        free(buf);
        COVER_dictSelectionError(sVar4);
      }
    }
    else {
      free(dict);
      free(buf);
      COVER_dictSelectionError(sVar4);
    }
  }
  return in_RDI;
}

Assistant:

COVER_dictSelection_t COVER_selectDict(BYTE* customDictContent, size_t dictBufferCapacity,
        size_t dictContentSize, const BYTE* samplesBuffer, const size_t* samplesSizes, unsigned nbFinalizeSamples,
        size_t nbCheckSamples, size_t nbSamples, ZDICT_cover_params_t params, size_t* offsets, size_t totalCompressedSize) {

  size_t largestDict = 0;
  size_t largestCompressed = 0;
  BYTE* customDictContentEnd = customDictContent + dictContentSize;

  BYTE * largestDictbuffer = (BYTE *)malloc(dictBufferCapacity);
  BYTE * candidateDictBuffer = (BYTE *)malloc(dictBufferCapacity);
  double regressionTolerance = ((double)params.shrinkDictMaxRegression / 100.0) + 1.00;

  if (!largestDictbuffer || !candidateDictBuffer) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(dictContentSize);
  }

  /* Initial dictionary size and compressed size */
  memcpy(largestDictbuffer, customDictContent, dictContentSize);
  dictContentSize = ZDICT_finalizeDictionary(
    largestDictbuffer, dictBufferCapacity, customDictContent, dictContentSize,
    samplesBuffer, samplesSizes, nbFinalizeSamples, params.zParams);

  if (ZDICT_isError(dictContentSize)) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(dictContentSize);
  }

  totalCompressedSize = COVER_checkTotalCompressedSize(params, samplesSizes,
                                                       samplesBuffer, offsets,
                                                       nbCheckSamples, nbSamples,
                                                       largestDictbuffer, dictContentSize);

  if (ZSTD_isError(totalCompressedSize)) {
    free(largestDictbuffer);
    free(candidateDictBuffer);
    return COVER_dictSelectionError(totalCompressedSize);
  }

  if (params.shrinkDict == 0) {
    free(candidateDictBuffer);
    return setDictSelection(largestDictbuffer, dictContentSize, totalCompressedSize);
  }

  largestDict = dictContentSize;
  largestCompressed = totalCompressedSize;
  dictContentSize = ZDICT_DICTSIZE_MIN;

  /* Largest dict is initially at least ZDICT_DICTSIZE_MIN */
  while (dictContentSize < largestDict) {
    memcpy(candidateDictBuffer, largestDictbuffer, largestDict);
    dictContentSize = ZDICT_finalizeDictionary(
      candidateDictBuffer, dictBufferCapacity, customDictContentEnd - dictContentSize, dictContentSize,
      samplesBuffer, samplesSizes, nbFinalizeSamples, params.zParams);

    if (ZDICT_isError(dictContentSize)) {
      free(largestDictbuffer);
      free(candidateDictBuffer);
      return COVER_dictSelectionError(dictContentSize);

    }

    totalCompressedSize = COVER_checkTotalCompressedSize(params, samplesSizes,
                                                         samplesBuffer, offsets,
                                                         nbCheckSamples, nbSamples,
                                                         candidateDictBuffer, dictContentSize);

    if (ZSTD_isError(totalCompressedSize)) {
      free(largestDictbuffer);
      free(candidateDictBuffer);
      return COVER_dictSelectionError(totalCompressedSize);
    }

    if ((double)totalCompressedSize <= (double)largestCompressed * regressionTolerance) {
      free(largestDictbuffer);
      return setDictSelection( candidateDictBuffer, dictContentSize, totalCompressedSize );
    }
    dictContentSize *= 2;
  }
  dictContentSize = largestDict;
  totalCompressedSize = largestCompressed;
  free(candidateDictBuffer);
  return setDictSelection( largestDictbuffer, dictContentSize, totalCompressedSize );
}